

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetBytesDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  undefined1 uVar1;
  undefined1 uVar3;
  undefined2 uVar4;
  EnumValueDescriptor *pEVar2;
  undefined4 uVar5;
  char *in_RCX;
  AlphaNum *in_R8;
  string_view input;
  string local_c8;
  string_view local_a8 [3];
  AlphaNum local_78;
  AlphaNum local_48;
  
  if (((descriptor->field_20).default_value_enum_)->all_names_ == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"pb::ByteString.Empty",(allocator<char> *)local_a8);
  }
  else {
    local_a8[0] = absl::lts_20250127::NullSafeStringView("pb::ByteString.FromBase64(\"");
    pEVar2 = (descriptor->field_20).default_value_enum_;
    uVar1 = pEVar2->super_SymbolBaseN<0>;
    uVar3 = pEVar2->super_SymbolBaseN<1>;
    uVar4 = *(undefined2 *)&pEVar2->field_0x2;
    uVar5 = pEVar2->number_;
    input._M_len._4_4_ = uVar5;
    input._M_len._2_2_ = uVar4;
    input._M_len._1_1_ = uVar3;
    input._M_len._0_1_ = uVar1;
    input._M_str = in_RCX;
    StringToBase64_abi_cxx11_(&local_c8,(csharp *)pEVar2->all_names_,input);
    local_48.piece_._M_len = local_c8._M_string_length;
    local_48.piece_._M_str = local_c8._M_dataplus._M_p;
    local_78.piece_ = absl::lts_20250127::NullSafeStringView("\")");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)local_a8,&local_48,&local_78,in_R8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetBytesDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "pb::ByteString.Empty";
    return absl::StrCat("pb::ByteString.FromBase64(\"",
                        StringToBase64(descriptor->default_value_string()),
                        "\")");
}